

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext::IfcGeometricRepresentationContext
          (IfcGeometricRepresentationContext *this,void **vtt)

{
  void **vtt_local;
  IfcGeometricRepresentationContext *this_local;
  
  IfcRepresentationContext::IfcRepresentationContext(&this->super_IfcRepresentationContext,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext,_4UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationContext,_4UL> *)
             &(this->super_IfcRepresentationContext).field_0x60,vtt + 5);
  (this->super_IfcRepresentationContext).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcRepresentationContext).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcRepresentationContext).
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                  _vptr_ObjectHelper[-3]) = vtt[7];
  *(void **)&(this->super_IfcRepresentationContext).field_0x60 = vtt[8];
  STEP::Maybe<double>::Maybe(&this->Precision);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->WorldCoordinateSystem);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Maybe(&this->TrueNorth);
  return;
}

Assistant:

IfcGeometricRepresentationContext() : Object("IfcGeometricRepresentationContext") {}